

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BBlock.h
# Opt level: O0

void __thiscall dg::BBlock<dg::LLVMNode>::isolate(BBlock<dg::LLVMNode> *this)

{
  BBlockEdge n;
  BBlockEdge n_00;
  bool bVar1;
  pointer pBVar2;
  reference pBVar3;
  reference ppBVar4;
  BBlock<dg::LLVMNode> *in_RDI;
  BBlock<dg::LLVMNode> *B_1;
  iterator __end0_4;
  iterator __begin0_4;
  BBlockContainerT *__range2_2;
  BBlock<dg::LLVMNode> *B;
  iterator __end0_3;
  iterator __begin0_3;
  BBlockContainerT *__range2_1;
  BBlockEdge *edge;
  iterator __end0_2;
  iterator __begin0_2;
  DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U> *__range3;
  BBlockEdge *succ;
  iterator __end0_1;
  iterator __begin0_1;
  SuccContainerT *__range5;
  _Self cur;
  iterator E;
  iterator I;
  DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U> new_edges;
  BBlock<dg::LLVMNode> *pred;
  iterator __end0;
  iterator __begin0;
  PredContainerT *__range2;
  BBlock<dg::LLVMNode> *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U> *in_stack_fffffffffffffef0;
  _Self in_stack_fffffffffffffef8;
  _Self in_stack_ffffffffffffff00;
  _Self local_e8;
  _Self local_e0;
  BBlockContainerT *local_d8;
  reference local_d0;
  _Self local_c8;
  _Self local_c0;
  undefined1 *local_b8;
  BBlock<dg::LLVMNode> *local_b0;
  undefined8 local_a8;
  BBlockEdge local_a0;
  reference local_90;
  _Self local_88;
  _Self local_80;
  SuccContainerT *local_78;
  _Base_ptr local_70;
  _Self local_68;
  _Self local_60;
  undefined1 local_58 [48];
  BBlock<dg::LLVMNode> *local_28;
  _Self local_20;
  _Self local_18;
  PredContainerT *local_10;
  
  local_10 = &in_RDI->prevBBs;
  local_18._M_node =
       (_Base_ptr)
       DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>::begin
                 ((DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U> *)in_stack_fffffffffffffed8);
  local_20._M_node =
       (_Base_ptr)
       DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>::end
                 ((DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U> *)in_stack_fffffffffffffed8);
  while (bVar1 = std::operator!=(&local_18,&local_20), bVar1) {
    ppBVar4 = std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*>::operator*
                        ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*> *)0x1af41d);
    local_28 = *ppBVar4;
    DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U>::DGContainer
              ((DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U> *)0x1af435);
    local_60._M_node =
         (_Base_ptr)
         DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U>::begin
                   ((DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U> *)
                    in_stack_fffffffffffffed8);
    local_68._M_node =
         (_Base_ptr)
         DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U>::end
                   ((DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U> *)
                    in_stack_fffffffffffffed8);
    while (bVar1 = std::operator!=(&local_60,&local_68), bVar1) {
      local_70 = (_Base_ptr)
                 std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge>::operator++
                           ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge> *)in_RDI,
                            in_stack_fffffffffffffee4);
      pBVar2 = std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge>::operator->
                         ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge> *)0x1af4a9)
      ;
      if (pBVar2->target == in_RDI) {
        local_78 = &in_RDI->nextBBs;
        local_80._M_node =
             (_Base_ptr)
             DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U>::begin
                       ((DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U> *)
                        in_stack_fffffffffffffed8);
        local_88._M_node =
             (_Base_ptr)
             DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U>::end
                       ((DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U> *)
                        in_stack_fffffffffffffed8);
        while (bVar1 = std::operator!=(&local_80,&local_88), bVar1) {
          local_90 = std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge>::operator*
                               ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge> *)
                                0x1af51d);
          if (local_90->target != in_RDI) {
            in_stack_fffffffffffffee0 = SUB84(local_90->target,0);
            in_stack_fffffffffffffee4 = (int)((ulong)local_90->target >> 0x20);
            pBVar2 = std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge>::operator->
                               ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge> *)
                                0x1af554);
            BBlockEdge::BBlockEdge
                      (&local_a0,
                       (BBlock<dg::LLVMNode> *)
                       CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),pBVar2->label);
            n_00._8_8_ = in_stack_ffffffffffffff00._M_node;
            n_00.target = (BBlock<dg::LLVMNode> *)in_stack_fffffffffffffef8._M_node;
            DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U>::insert
                      (in_stack_fffffffffffffef0,n_00);
          }
          std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge>::operator++
                    ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge> *)
                     CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        }
        in_stack_fffffffffffffed8 = (BBlock<dg::LLVMNode> *)&local_28->nextBBs;
        pBVar3 = std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge>::operator*
                           ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge> *)
                            0x1af5b8);
        local_b0 = pBVar3->target;
        local_a8 = *(undefined8 *)&pBVar3->label;
        n._8_4_ = in_stack_fffffffffffffee0;
        n.target = in_stack_fffffffffffffed8;
        n._12_4_ = in_stack_fffffffffffffee4;
        DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U>::erase
                  ((DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U> *)0x1af5e2,n);
      }
    }
    local_b8 = local_58;
    local_c0._M_node =
         (_Base_ptr)
         DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U>::begin
                   ((DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U> *)
                    in_stack_fffffffffffffed8);
    local_c8._M_node =
         (_Base_ptr)
         DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U>::end
                   ((DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U> *)
                    in_stack_fffffffffffffed8);
    while (bVar1 = std::operator!=(&local_c0,&local_c8), bVar1) {
      local_d0 = std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge>::operator*
                           ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge> *)
                            0x1af631);
      addSuccessor((BBlock<dg::LLVMNode> *)in_stack_ffffffffffffff00._M_node,
                   (BBlockEdge *)in_stack_fffffffffffffef8._M_node);
      std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge>::operator++
                ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    }
    DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U>::~DGContainer
              ((DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U> *)0x1af661);
    std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*>::operator++
              ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  }
  removeSuccessors((BBlock<dg::LLVMNode> *)in_stack_ffffffffffffff00._M_node);
  DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>::clear
            ((DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U> *)0x1af68b);
  local_d8 = &in_RDI->controlDeps;
  local_e0._M_node =
       (_Base_ptr)
       DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>::begin
                 ((DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U> *)in_stack_fffffffffffffed8);
  local_e8._M_node =
       (_Base_ptr)
       DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>::end
                 ((DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U> *)in_stack_fffffffffffffed8);
  while (bVar1 = std::operator!=(&local_e0,&local_e8), bVar1) {
    ppBVar4 = std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*>::operator*
                        ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*> *)0x1af6d8);
    if (*ppBVar4 != in_RDI) {
      DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>::erase
                ((DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 in_stack_fffffffffffffed8);
    }
    std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*>::operator++
              ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  }
  DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>::begin
            ((DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U> *)in_stack_fffffffffffffed8);
  DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>::end
            ((DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U> *)in_stack_fffffffffffffed8);
  while (bVar1 = std::operator!=((_Self *)&stack0xffffffffffffff00,(_Self *)&stack0xfffffffffffffef8
                                ), bVar1) {
    ppBVar4 = std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*>::operator*
                        ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*> *)0x1af760);
    if (*ppBVar4 != in_RDI) {
      DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>::erase
                ((DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 in_stack_fffffffffffffed8);
    }
    std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*>::operator++
              ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  }
  DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>::clear
            ((DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U> *)0x1af7ac);
  DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>::clear
            ((DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U> *)0x1af7bd);
  return;
}

Assistant:

void isolate() {
        // take every predecessor and reconnect edges from it
        // to successors
        for (BBlock<NodeT> *pred : prevBBs) {
            // find the edge that is going to this node
            // and create new edges to all successors. The new edges
            // will have the same label as the found one
            DGContainer<BBlockEdge> new_edges;
            for (auto I = pred->nextBBs.begin(), E = pred->nextBBs.end();
                 I != E;) {
                auto cur = I++;
                if (cur->target == this) {
                    // create edges that will go from the predecessor
                    // to every successor of this node
                    for (const BBlockEdge &succ : nextBBs) {
                        // we cannot create an edge to this bblock (we're
                        // isolating _this_ bblock), that would be incorrect. It
                        // can occur when we're isolatin a bblock with self-loop
                        if (succ.target != this)
                            new_edges.insert(
                                    BBlockEdge(succ.target, cur->label));
                    }

                    // remove the edge from predecessor
                    pred->nextBBs.erase(*cur);
                }
            }

            // add newly created edges to predecessor
            for (const BBlockEdge &edge : new_edges) {
                assert(edge.target != this &&
                       "Adding an edge to a block that is being isolated");
                pred->addSuccessor(edge);
            }
        }

        removeSuccessors();

        // NOTE: nextBBs were cleared in removeSuccessors()
        prevBBs.clear();

        // remove reverse edges to this BB
        for (BBlock<NodeT> *B : controlDeps) {
            // we don't want to corrupt the iterator
            // if this block is control dependent on itself.
            // We're gonna clear it anyway
            if (B == this)
                continue;

            B->revControlDeps.erase(this);
        }

        // clear also cd edges that blocks have
        // to this block
        for (BBlock<NodeT> *B : revControlDeps) {
            if (B == this)
                continue;

            B->controlDeps.erase(this);
        }

        revControlDeps.clear();
        controlDeps.clear();
    }